

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CoverageBinsArraySizeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CoverageBinsArraySizeSyntax,slang::parsing::Token&,slang::syntax::ExpressionSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,ExpressionSyntax **args_1,Token *args_2)

{
  ExpressionSyntax *pEVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  CoverageBinsArraySizeSyntax *pCVar12;
  
  pCVar12 = (CoverageBinsArraySizeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CoverageBinsArraySizeSyntax *)this->endPtr < pCVar12 + 1) {
    pCVar12 = (CoverageBinsArraySizeSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pCVar12 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar2 = args->info;
  pEVar1 = *args_1;
  TVar8 = args_2->kind;
  uVar9 = args_2->field_0x2;
  NVar10.raw = (args_2->numFlags).raw;
  uVar11 = args_2->rawLen;
  pIVar3 = args_2->info;
  (pCVar12->super_SyntaxNode).kind = CoverageBinsArraySize;
  (pCVar12->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pCVar12->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pCVar12->openBracket).kind = TVar4;
  (pCVar12->openBracket).field_0x2 = uVar5;
  (pCVar12->openBracket).numFlags = (NumericTokenFlags)NVar6.raw;
  (pCVar12->openBracket).rawLen = uVar7;
  (pCVar12->openBracket).info = pIVar2;
  pCVar12->expr = pEVar1;
  (pCVar12->closeBracket).kind = TVar8;
  (pCVar12->closeBracket).field_0x2 = uVar9;
  (pCVar12->closeBracket).numFlags = (NumericTokenFlags)NVar10.raw;
  (pCVar12->closeBracket).rawLen = uVar11;
  (pCVar12->closeBracket).info = pIVar3;
  if (pEVar1 != (ExpressionSyntax *)0x0) {
    (pEVar1->super_SyntaxNode).parent = &pCVar12->super_SyntaxNode;
  }
  return pCVar12;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }